

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_handle_line(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  error_flags eVar3;
  Parser *in_RDI;
  bool bVar4;
  char msg [53];
  Parser *in_stack_000002f8;
  Parser *in_stack_00000380;
  Parser *in_stack_000004f0;
  Parser *in_stack_00000500;
  Parser *in_stack_00000520;
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  size_t local_50;
  char local_48 [16];
  Parser *in_stack_ffffffffffffffc8;
  
  bVar4 = true;
  if ((in_RDI->m_state->line_contents).rem.len != 0) {
    bVar4 = (in_RDI->m_state->line_contents).rem.str == (char *)0x0;
  }
  if (bVar4) {
    memcpy(local_48,"check failed: (! m_state->line_contents.rem.empty())",0x35);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    LVar2.super_LineCol.line = uStack_68;
    LVar2.super_LineCol.offset = local_70;
    LVar2.super_LineCol.col = local_60;
    LVar2.name.str = (char *)uStack_58;
    LVar2.name.len = local_50;
    (*p_Var1)(local_48,0x35,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
  }
  bVar4 = has_any(in_RDI,8);
  if (bVar4) {
    bVar4 = has_any(in_RDI,0x10);
    if (bVar4) {
      bVar4 = _handle_seq_flow(in_stack_000002f8);
      if (bVar4) {
        return;
      }
    }
    else {
      bVar4 = _handle_seq_blck(in_stack_00000380);
      if (bVar4) {
        return;
      }
    }
  }
  else {
    bVar4 = has_any(in_RDI,4);
    if (bVar4) {
      bVar4 = has_any(in_RDI,0x10);
      if (bVar4) {
        bVar4 = _handle_map_flow(in_stack_000004f0);
        if (bVar4) {
          return;
        }
      }
      else {
        bVar4 = _handle_map_blck(in_stack_00000520);
        if (bVar4) {
          return;
        }
      }
    }
    else {
      bVar4 = has_any(in_RDI,2);
      if ((bVar4) && (bVar4 = _handle_unk(in_stack_00000500), bVar4)) {
        return;
      }
    }
  }
  _handle_top(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Parser::_handle_line()
{
    _c4dbgq("\n-----------");
    _c4dbgt("handling line={}, offset={}B", m_state->pos.line, m_state->pos.offset);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_state->line_contents.rem.empty());
    if(has_any(RSEQ))
    {
        if(has_any(FLOW))
        {
            if(_handle_seq_flow())
                return;
        }
        else
        {
            if(_handle_seq_blck())
                return;
        }
    }
    else if(has_any(RMAP))
    {
        if(has_any(FLOW))
        {
            if(_handle_map_flow())
                return;
        }
        else
        {
            if(_handle_map_blck())
                return;
        }
    }
    else if(has_any(RUNK))
    {
        if(_handle_unk())
            return;
    }

    if(_handle_top())
        return;
}